

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_us * stbi_load_16_from_callbacks
                    (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *channels_in_file,
                    int desired_channels)

{
  stbi__uint16 *psVar1;
  undefined1 local_110 [8];
  stbi__context s;
  
  stbi__start_callbacks((stbi__context *)local_110,clbk,user);
  psVar1 = stbi__load_and_postprocess_16bit
                     ((stbi__context *)local_110,x,y,channels_in_file,desired_channels);
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *channels_in_file, int desired_channels)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *)clbk, user);
   return stbi__load_and_postprocess_16bit(&s,x,y,channels_in_file,desired_channels);
}